

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O1

void absl::lts_20250127::str_format_internal::anon_unknown_0::PrintExponent
               (int exp,char e,Buffer *out)

{
  undefined1 *puVar1;
  char *pcVar2;
  ulong uVar3;
  byte *pbVar4;
  byte bVar5;
  
  pcVar2 = out->end;
  puVar1 = &out->field_0x55;
  if (puVar1 <= pcVar2) goto LAB_01067b55;
  out->end = pcVar2 + 1;
  *pcVar2 = e;
  pcVar2 = out->end;
  if (exp < 0) {
    if (puVar1 <= pcVar2) goto LAB_01067b55;
    out->end = pcVar2 + 1;
    *pcVar2 = '-';
    exp = -exp;
  }
  else {
    if (puVar1 <= pcVar2) goto LAB_01067b55;
    out->end = pcVar2 + 1;
    *pcVar2 = '+';
  }
  pbVar4 = (byte *)out->end;
  uVar3 = (ulong)(uint)exp;
  if (exp < 100) {
    if (puVar1 <= pbVar4) goto LAB_01067b55;
    bVar5 = (char)(uVar3 / 10) + 0x30;
  }
  else {
    if (puVar1 <= pbVar4) goto LAB_01067b55;
    out->end = (char *)(pbVar4 + 1);
    *pbVar4 = (char)(uVar3 / 100) + 0x30;
    pbVar4 = (byte *)out->end;
    if (puVar1 <= pbVar4) goto LAB_01067b55;
    bVar5 = (char)((uint)exp / 10) + (char)((uVar3 / 10) * 0x1999999a >> 0x20) * -10 | 0x30;
  }
  out->end = (char *)(pbVar4 + 1);
  *pbVar4 = bVar5;
  pbVar4 = (byte *)out->end;
  if (pbVar4 < puVar1) {
    out->end = (char *)(pbVar4 + 1);
    *pbVar4 = (char)exp + (char)((uint)exp / 10) * -10 | 0x30;
    return;
  }
LAB_01067b55:
  __assert_fail("end < data + sizeof(data)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/str_format/float_conversion.cc"
                ,0x3f3,
                "void absl::str_format_internal::(anonymous namespace)::Buffer::push_back(char)");
}

Assistant:

void PrintExponent(int exp, char e, Buffer *out) {
  out->push_back(e);
  if (exp < 0) {
    out->push_back('-');
    exp = -exp;
  } else {
    out->push_back('+');
  }
  // Exponent digits.
  if (exp > 99) {
    out->push_back(static_cast<char>(exp / 100 + '0'));
    out->push_back(static_cast<char>(exp / 10 % 10 + '0'));
    out->push_back(static_cast<char>(exp % 10 + '0'));
  } else {
    out->push_back(static_cast<char>(exp / 10 + '0'));
    out->push_back(static_cast<char>(exp % 10 + '0'));
  }
}